

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall Instance::name_abi_cxx11_(string *__return_storage_ptr__,Instance *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_name);
  return __return_storage_ptr__;
}

Assistant:

std::string Instance::name() const {
    return _name;
}